

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClip.cpp
# Opt level: O2

PatternClip * __thiscall PatternClip::operator=(PatternClip *this,PatternClip *clip)

{
  undefined8 uVar1;
  int iVar2;
  PatternSelection local_38;
  undefined8 local_20;
  
  local_20 = 0;
  std::__exchange<std::unique_ptr<char[],std::default_delete<char[]>>,decltype(nullptr)>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38,(void **)clip);
  uVar1 = local_38.mStart.super_PatternCursorBase._0_8_;
  local_38.mStart.super_PatternCursorBase.row = 0;
  local_38.mStart.super_PatternCursorBase.column = 0;
  std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
            ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this,(pointer)uVar1);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  iVar2 = (clip->mLocation).mEnd.super_PatternCursorBase.track;
  (this->mLocation).mEnd.super_PatternCursorBase.column =
       (clip->mLocation).mEnd.super_PatternCursorBase.column;
  (this->mLocation).mEnd.super_PatternCursorBase.track = iVar2;
  iVar2 = (clip->mLocation).mStart.super_PatternCursorBase.column;
  uVar1 = *(undefined8 *)&(clip->mLocation).mStart.super_PatternCursorBase.track;
  (this->mLocation).mStart.super_PatternCursorBase.row =
       (clip->mLocation).mStart.super_PatternCursorBase.row;
  (this->mLocation).mStart.super_PatternCursorBase.column = iVar2;
  *(undefined8 *)&(this->mLocation).mStart.super_PatternCursorBase.track = uVar1;
  PatternSelection::PatternSelection(&local_38);
  (clip->mLocation).mEnd.super_PatternCursorBase.column =
       local_38.mEnd.super_PatternCursorBase.column;
  (clip->mLocation).mEnd.super_PatternCursorBase.track = local_38.mEnd.super_PatternCursorBase.track
  ;
  (clip->mLocation).mStart.super_PatternCursorBase.row = local_38.mStart.super_PatternCursorBase.row
  ;
  (clip->mLocation).mStart.super_PatternCursorBase.column =
       local_38.mStart.super_PatternCursorBase.column;
  *(undefined8 *)&(clip->mLocation).mStart.super_PatternCursorBase.track = local_38._8_8_;
  return this;
}

Assistant:

PatternClip& PatternClip::operator=(PatternClip &&clip) noexcept {
    // move the clips data to ours, resetting the clip's data
    mData = std::exchange(clip.mData, nullptr);
    mLocation = clip.mLocation;
    clip.mLocation = {};
    return *this;
}